

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImBezierClosestPointCasteljau
                 (ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,ImVec2 *p,float tess_tol)

{
  float local_4c;
  ImVec2 IStack_48;
  float p_closest_dist2;
  ImVec2 p_last;
  float tess_tol_local;
  ImVec2 *p_local;
  ImVec2 *p4_local;
  ImVec2 *p3_local;
  ImVec2 *p2_local;
  ImVec2 *p1_local;
  ImVec2 p_closest;
  
  p_last.y = tess_tol;
  if (0.0 < tess_tol) {
    IStack_48 = *p1;
    ImVec2::ImVec2((ImVec2 *)&p1_local);
    local_4c = 3.4028235e+38;
    BezierClosestPointCasteljauStep
              (p,(ImVec2 *)&p1_local,&stack0xffffffffffffffb8,&local_4c,p1->x,p1->y,p2->x,p2->y,
               p3->x,p3->y,p4->x,p4->y,p_last.y,0);
    return (ImVec2)p1_local;
  }
  __assert_fail("tess_tol > 0.0f",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                ,0x4bf,
                "ImVec2 ImBezierClosestPointCasteljau(const ImVec2 &, const ImVec2 &, const ImVec2 &, const ImVec2 &, const ImVec2 &, float)"
               );
}

Assistant:

ImVec2 ImBezierClosestPointCasteljau(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, const ImVec2& p, float tess_tol)
{
    IM_ASSERT(tess_tol > 0.0f);
    ImVec2 p_last = p1;
    ImVec2 p_closest;
    float p_closest_dist2 = FLT_MAX;
    BezierClosestPointCasteljauStep(p, p_closest, p_last, p_closest_dist2, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, p4.x, p4.y, tess_tol, 0);
    return p_closest;
}